

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Parser.h
# Opt level: O1

vector<soul::pool_ref<soul::AST::UnqualifiedName>,_std::allocator<soul::pool_ref<soul::AST::UnqualifiedName>_>_>
* __thiscall
soul::StructuralParser::parseGenericFunctionWildcardList
          (vector<soul::pool_ref<soul::AST::UnqualifiedName>,_std::allocator<soul::pool_ref<soul::AST::UnqualifiedName>_>_>
           *__return_storage_ptr__,StructuralParser *this)

{
  char *__s1;
  bool bVar1;
  int iVar2;
  CompileMessage local_68;
  
  (__return_storage_ptr__->
  super__Vector_base<soul::pool_ref<soul::AST::UnqualifiedName>,_std::allocator<soul::pool_ref<soul::AST::UnqualifiedName>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<soul::pool_ref<soul::AST::UnqualifiedName>,_std::allocator<soul::pool_ref<soul::AST::UnqualifiedName>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<soul::pool_ref<soul::AST::UnqualifiedName>,_std::allocator<soul::pool_ref<soul::AST::UnqualifiedName>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  while( true ) {
    __s1 = (this->super_SOULTokeniser).currentType.text;
    if ((__s1 != "$identifier") &&
       ((__s1 == (char *)0x0 || (iVar2 = strcmp(__s1,"$identifier"), iVar2 != 0)))) {
      CompileMessageHelpers::createMessage<>
                (&local_68,syntax,error,"Expected a generic function wildcard name");
      (*(this->super_SOULTokeniser)._vptr_Tokeniser[2])(this,&local_68);
      RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_68.location.sourceCode.object);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68.description._M_dataplus._M_p != &local_68.description.field_2) {
        operator_delete(local_68.description._M_dataplus._M_p,
                        local_68.description.field_2._M_allocated_capacity + 1);
      }
    }
    local_68.description._M_dataplus._M_p = (pointer)parseUnqualifiedName(this);
    std::
    vector<soul::pool_ref<soul::AST::UnqualifiedName>,std::allocator<soul::pool_ref<soul::AST::UnqualifiedName>>>
    ::emplace_back<soul::pool_ref<soul::AST::UnqualifiedName>>
              ((vector<soul::pool_ref<soul::AST::UnqualifiedName>,std::allocator<soul::pool_ref<soul::AST::UnqualifiedName>>>
                *)__return_storage_ptr__,(pool_ref<soul::AST::UnqualifiedName> *)&local_68);
    bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
            ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x289596);
    if (bVar1) break;
    Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
    ::expect<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x26375e);
    if (bVar1) {
      return __return_storage_ptr__;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<pool_ref<AST::UnqualifiedName>> parseGenericFunctionWildcardList()
    {
        std::vector<pool_ref<AST::UnqualifiedName>> wildcards;

        for (;;)
        {
            if (! matches (Token::identifier))
                throwError (Errors::expectedGenericWildcardName());

            auto& wildcard = parseUnqualifiedName();

            wildcards.push_back (wildcard);

            if (matchIf (Operator::greaterThan))
                break;

            expect (Operator::comma);
        }

        return wildcards;
    }